

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O0

crypto_word_t
abi_test::internal::
CheckImpl<int,evp_aead_ctx_st*,unsigned_char*,unsigned_long*,unsigned_char_const*,unsigned_char_const*,unsigned_long,unsigned_char_const*,unsigned_long>
          (Result *out,bool unwind,
          _func_int_evp_aead_ctx_st_ptr_uchar_ptr_unsigned_long_ptr_uchar_ptr_uchar_ptr_unsigned_long_uchar_ptr_unsigned_long
          *func,Type args,Type args_1,Type args_2,Type args_3,Type args_4,Type_conflict args_5,
          Type args_6,Type_conflict args_7)

{
  crypto_word_t cVar1;
  crypto_word_t *local_90;
  crypto_word_t local_88;
  crypto_word_t argv [9];
  Type args_local_2;
  Type args_local_1;
  Type args_local;
  _func_int_evp_aead_ctx_st_ptr_uchar_ptr_unsigned_long_ptr_uchar_ptr_uchar_ptr_unsigned_long_uchar_ptr_unsigned_long
  *func_local;
  bool unwind_local;
  Result *out_local;
  
  local_88 = ToWord<evp_aead_ctx_st*>(args);
  argv[0] = ToWord<unsigned_char*>(args_1);
  argv[1] = ToWord<unsigned_long*>(args_2);
  argv[2] = ToWord<unsigned_char_const*>(args_3);
  argv[3] = ToWord<unsigned_char_const*>(args_4);
  argv[4] = ToWord<unsigned_long>(args_5);
  argv[5] = ToWord<unsigned_char_const*>(args_6);
  argv[6] = ToWord<unsigned_long>(args_7);
  local_90 = argv + 7;
  do {
    *local_90 = 0;
    local_90 = local_90 + 1;
  } while (local_90 != argv + 8);
  cVar1 = RunTrampoline(out,(crypto_word_t)func,&local_88,8,unwind);
  return cVar1;
}

Assistant:

inline crypto_word_t CheckImpl(Result *out, bool unwind, R (*func)(Args...),
                               typename DeductionGuard<Args>::Type... args) {
  // We only support up to 8 arguments, so all arguments on aarch64 are passed
  // in registers. This is simpler and avoids the iOS discrepancy around packing
  // small arguments on the stack. (See the iOS64 reference.)
  static_assert(sizeof...(args) <= 8,
                "too many arguments for abi_test_trampoline");

  // Allocate one extra entry so MSVC does not complain about zero-size arrays.
  crypto_word_t argv[sizeof...(args) + 1] = {
      ToWord(args)...,
  };
  return RunTrampoline(out, reinterpret_cast<crypto_word_t>(func), argv,
                       sizeof...(args), unwind);
}